

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

int __thiscall re2::NFA::Step(NFA *this,Threadq *runq,Threadq *nextq,int c,int flag,char *p)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  pointer pIVar4;
  char *pcVar5;
  ostream *poVar6;
  int __c;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  *__rhs;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_208;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_200;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_1f8 [3];
  LogMessage local_1e0;
  Inst *local_60;
  Inst *ip;
  Thread *pTStack_50;
  int id;
  Thread *t;
  __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
  local_40;
  iterator i;
  char *p_local;
  int flag_local;
  int c_local;
  Threadq *nextq_local;
  Threadq *runq_local;
  NFA *this_local;
  
  i._M_current = (IndexValue *)p;
  SparseArray<re2::NFA::Thread_*>::clear(nextq);
  local_40._M_current = (IndexValue *)SparseArray<re2::NFA::Thread_*>::begin(runq);
  do {
    t = (Thread *)SparseArray<re2::NFA::Thread_*>::end(runq);
    __rhs = (__normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
             *)&t;
    bVar1 = __gnu_cxx::operator!=(&local_40,__rhs);
    if (!bVar1) {
      SparseArray<re2::NFA::Thread_*>::clear(runq);
      return 0;
    }
    pIVar4 = __gnu_cxx::
             __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
             ::operator->(&local_40);
    pTStack_50 = pIVar4->second;
    if (pTStack_50 != (Thread *)0x0) {
      if ((((this->longest_ & 1U) == 0) || ((this->matched_ & 1U) == 0)) ||
         (*pTStack_50->capture <= *this->match_)) {
        pIVar4 = __gnu_cxx::
                 __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                 ::operator->(&local_40);
        pcVar5 = SparseArray<re2::NFA::Thread_*>::IndexValue::index(pIVar4,(char *)__rhs,__c);
        ip._4_4_ = (int)pcVar5;
        local_60 = Prog::inst(this->prog_,ip._4_4_);
        IVar2 = Prog::Inst::opcode(local_60);
        if (IVar2 == kInstAltMatch) {
          local_1f8[0]._M_current = (IndexValue *)SparseArray<re2::NFA::Thread_*>::begin(runq);
          bVar1 = __gnu_cxx::operator!=(&local_40,local_1f8);
          if ((!bVar1) &&
             ((bVar1 = Prog::Inst::greedy(local_60,this->prog_), bVar1 ||
              ((this->longest_ & 1U) != 0)))) {
            CopyCapture(this,this->match_,pTStack_50->capture);
            this->matched_ = true;
            Decref(this,pTStack_50);
            __gnu_cxx::
            __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
            ::operator++(&local_40);
            while( true ) {
              local_200._M_current = (IndexValue *)SparseArray<re2::NFA::Thread_*>::end(runq);
              bVar1 = __gnu_cxx::operator!=(&local_40,&local_200);
              if (!bVar1) break;
              pIVar4 = __gnu_cxx::
                       __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                       ::operator->(&local_40);
              Decref(this,pIVar4->second);
              __gnu_cxx::
              __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
              ::operator++(&local_40);
            }
            SparseArray<re2::NFA::Thread_*>::clear(runq);
            bVar1 = Prog::Inst::greedy(local_60,this->prog_);
            if (!bVar1) {
              iVar3 = Prog::Inst::out(local_60);
              return iVar3;
            }
            iVar3 = Prog::Inst::out1(local_60);
            return iVar3;
          }
        }
        else if (IVar2 == kInstByteRange) {
          iVar3 = Prog::Inst::out(local_60);
          AddToThreadq(this,nextq,iVar3,c,flag,(char *)((long)&(i._M_current)->second + 1),
                       pTStack_50);
        }
        else if (IVar2 == kInstMatch) {
          if (((this->endmatch_ & 1U) == 0) || (i._M_current == (IndexValue *)this->etext_)) {
            if ((this->longest_ & 1U) == 0) {
              CopyCapture(this,this->match_,pTStack_50->capture);
              this->match_[1] = (char *)i._M_current;
              this->matched_ = true;
              Decref(this,pTStack_50);
              __gnu_cxx::
              __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
              ::operator++(&local_40);
              while( true ) {
                local_208._M_current = (IndexValue *)SparseArray<re2::NFA::Thread_*>::end(runq);
                bVar1 = __gnu_cxx::operator!=(&local_40,&local_208);
                if (!bVar1) break;
                pIVar4 = __gnu_cxx::
                         __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                         ::operator->(&local_40);
                Decref(this,pIVar4->second);
                __gnu_cxx::
                __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
                ::operator++(&local_40);
              }
              SparseArray<re2::NFA::Thread_*>::clear(runq);
              return 0;
            }
            if ((((this->matched_ & 1U) == 0) || (*pTStack_50->capture < *this->match_)) ||
               ((*pTStack_50->capture == *this->match_ &&
                ((IndexValue *)this->match_[1] < i._M_current)))) {
              CopyCapture(this,this->match_,pTStack_50->capture);
              this->match_[1] = (char *)i._M_current;
              this->matched_ = true;
            }
          }
        }
        else {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                     0x15d);
          poVar6 = LogMessage::stream(&local_1e0);
          poVar6 = std::operator<<(poVar6,"Unhandled ");
          IVar2 = Prog::Inst::opcode(local_60);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,IVar2);
          std::operator<<(poVar6," in step");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e0);
        }
        Decref(this,pTStack_50);
      }
      else {
        Decref(this,pTStack_50);
      }
    }
    __gnu_cxx::
    __normal_iterator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_std::vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

int NFA::Step(Threadq* runq, Threadq* nextq, int c, int flag, const char* p) {
  nextq->clear();

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
    Thread* t = i->second;
    if (t == NULL)
      continue;

    if (longest_) {
      // Can skip any threads started after our current best match.
      if (matched_ && match_[0] < t->capture[0]) {
        Decref(t);
        continue;
      }
    }

    int id = i->index();
    Prog::Inst* ip = prog_->inst(id);

    switch (ip->opcode()) {
      default:
        // Should only see the values handled below.
        LOG(DFATAL) << "Unhandled " << ip->opcode() << " in step";
        break;

      case kInstByteRange:
        AddToThreadq(nextq, ip->out(), c, flag, p+1, t);
        break;

      case kInstAltMatch:
        if (i != runq->begin())
          break;
        // The match is ours if we want it.
        if (ip->greedy(prog_) || longest_) {
          CopyCapture(match_, t->capture);
          matched_ = true;

          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          if (ip->greedy(prog_))
            return ip->out1();
          return ip->out();
        }
        break;

      case kInstMatch:
        if (endmatch_ && p != etext_)
          break;

        if (longest_) {
          // Leftmost-longest mode: save this match only if
          // it is either farther to the left or at the same
          // point but longer than an existing match.
          if (!matched_ || t->capture[0] < match_[0] ||
              (t->capture[0] == match_[0] && p > match_[1])) {
            CopyCapture(match_, t->capture);
            match_[1] = p;
            matched_ = true;
          }
        } else {
          // Leftmost-biased mode: this match is by definition
          // better than what we've already found (see next line).
          CopyCapture(match_, t->capture);
          match_[1] = p;
          matched_ = true;

          // Cut off the threads that can only find matches
          // worse than the one we just found: don't run the
          // rest of the current Threadq.
          Decref(t);
          for (++i; i != runq->end(); ++i)
            Decref(i->second);
          runq->clear();
          return 0;
        }
        break;
    }
    Decref(t);
  }
  runq->clear();
  return 0;
}